

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O1

void __thiscall
cmCTestMultiProcessHandler::DeallocateResources(cmCTestMultiProcessHandler *this,int index)

{
  _Base_ptr p_Var1;
  map<_a129e267_> *this_00;
  bool bVar2;
  mapped_type *pmVar3;
  _Base_ptr p_Var4;
  pointer pmVar5;
  _Base_ptr id;
  pair<_48fe5278_> pVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> resourceType;
  int local_74;
  map<_a129e267_> *local_70;
  pointer local_68;
  pointer local_60;
  _Rb_tree_node_base *local_58;
  string local_50;
  
  if (this->TestHandler->UseResourceSpec == true) {
    local_70 = &this->AllocatedResources;
    local_74 = index;
    pmVar3 = std::map<$a129e267$>::operator[](local_70,&local_74);
    pmVar5 = (pmVar3->
             super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>_>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_68 = (pmVar3->
               super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>_>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    if (pmVar5 != local_68) {
      do {
        p_Var4 = (pmVar5->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        local_58 = &(pmVar5->_M_t)._M_impl.super__Rb_tree_header._M_header;
        local_60 = pmVar5;
        if (p_Var4 != local_58) {
          do {
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_50,*(long *)(p_Var4 + 1),
                       (long)&(p_Var4[1]._M_parent)->_M_color + *(long *)(p_Var4 + 1));
            p_Var1 = p_Var4[2]._M_parent;
            for (id = *(_Base_ptr *)(p_Var4 + 2); id != p_Var1; id = (_Base_ptr)&id[1]._M_parent) {
              bVar2 = cmCTestResourceAllocator::DeallocateResource
                                (&this->ResourceAllocator,&local_50,(string *)id,id[1]._M_color);
              if (!bVar2) {
                __assert_fail("success",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                              ,0x151,"void cmCTestMultiProcessHandler::DeallocateResources(int)");
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
            p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
          } while (p_Var4 != local_58);
        }
        pmVar5 = local_60 + 1;
      } while (pmVar5 != local_68);
    }
    this_00 = local_70;
    pVar6 = std::_Rb_tree<$81a34eb5$>::equal_range(&local_70->_M_t,&local_74);
    std::_Rb_tree<$81a34eb5$>::_M_erase_aux
              (&this_00->_M_t,(_Base_ptr)pVar6.first._M_node,(_Base_ptr)pVar6.second._M_node);
  }
  return;
}

Assistant:

void cmCTestMultiProcessHandler::DeallocateResources(int index)
{
  if (!this->TestHandler->UseResourceSpec) {
    return;
  }

  {
    auto& allocatedResources = this->AllocatedResources[index];
    for (auto const& processAlloc : allocatedResources) {
      for (auto const& it : processAlloc) {
        auto resourceType = it.first;
        for (auto const& it2 : it.second) {
          bool success = this->ResourceAllocator.DeallocateResource(
            resourceType, it2.Id, it2.Slots);
          (void)success;
          assert(success);
        }
      }
    }
  }
  this->AllocatedResources.erase(index);
}